

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casCore.c
# Opt level: O0

void WriteSingleOutputFunctionBlif
               (DdManager *dd,DdNode *aFunc,char **pNames,int nNames,char *FileName)

{
  FILE *__stream;
  FILE *pFile;
  int i;
  char *FileName_local;
  int nNames_local;
  char **pNames_local;
  DdNode *aFunc_local;
  DdManager *dd_local;
  
  __stream = fopen(FileName,"w");
  fprintf(__stream,".model %s\n",FileName);
  fprintf(__stream,".inputs");
  for (pFile._4_4_ = 0; pFile._4_4_ < nNames; pFile._4_4_ = pFile._4_4_ + 1) {
    fprintf(__stream," %s",pNames[pFile._4_4_]);
  }
  fprintf(__stream,"\n");
  fprintf(__stream,".outputs F");
  fprintf(__stream,"\n");
  WriteDDintoBLIFfile((FILE *)__stream,aFunc,"F","",pNames);
  fprintf(__stream,".end\n");
  fclose(__stream);
  return;
}

Assistant:

void WriteSingleOutputFunctionBlif( DdManager * dd, DdNode * aFunc, char ** pNames, int nNames, char * FileName )
{
    int i;
    FILE * pFile;

    // start the file
    pFile = fopen( FileName, "w" );
    fprintf( pFile, ".model %s\n", FileName );

    fprintf( pFile, ".inputs" );
    for ( i = 0; i < nNames; i++ )
        fprintf( pFile, " %s", pNames[i] );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".outputs F" );
    fprintf( pFile, "\n" );

    // write the DD into the file
    WriteDDintoBLIFfile( pFile, aFunc, "F", "", pNames );

    fprintf( pFile, ".end\n" );
    fclose( pFile );
}